

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

int nk_combo_begin_symbol(nk_context *ctx,nk_symbol_type symbol,nk_vec2 size)

{
  nk_vec2 nVar1;
  nk_color foreground;
  nk_symbol_type type;
  nk_window *win;
  nk_rect r;
  nk_rect rect;
  nk_rect header_00;
  undefined8 uVar2;
  undefined8 uVar3;
  nk_widget_layout_states nVar4;
  int iVar5;
  nk_color *pnVar6;
  long lVar7;
  nk_color c;
  nk_context *i;
  nk_style_combo *pnVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  nk_rect r_00;
  nk_rect rect_00;
  nk_rect content;
  nk_rect header;
  nk_rect local_50;
  nk_rect local_40;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x59cb,
                  "int nk_combo_begin_symbol(struct nk_context *, enum nk_symbol_type, struct nk_vec2)"
                 );
  }
  win = ctx->current;
  if (win != (nk_window *)0x0) {
    if (win->layout != (nk_panel *)0x0) {
      nVar4 = nk_widget(&header,ctx);
      fVar9 = header.h;
      fVar12 = header.w;
      uVar2 = header._0_8_;
      if (nVar4 == NK_WIDGET_INVALID) {
        iVar5 = 0;
      }
      else {
        i = ctx;
        if ((win->layout->flags & 0x1000) != 0) {
          i = (nk_context *)0x0;
        }
        if (nVar4 == NK_WIDGET_ROM) {
          i = (nk_context *)0x0;
        }
        rect_00.h = header.h;
        rect_00.w = header.w;
        r.w = header.w;
        r.x = header.x;
        r.y = header.y;
        r.h = header.h;
        iVar5 = nk_button_behavior(&ctx->last_widget_state,r,&i->input,NK_BUTTON_DEFAULT);
        uVar3 = header._0_8_;
        if ((ctx->last_widget_state & 0x20) == 0) {
          pnVar6 = &(ctx->style).combo.symbol_hover;
          if ((ctx->last_widget_state & 0x10) == 0) {
            pnVar8 = &(ctx->style).combo;
          }
          else {
            pnVar8 = (nk_style_combo *)&(ctx->style).combo.hover;
          }
        }
        else {
          pnVar8 = (nk_style_combo *)&(ctx->style).combo.active;
          pnVar6 = &(ctx->style).combo.symbol_active;
        }
        foreground = *pnVar6;
        header._0_8_ = uVar3;
        if ((pnVar8->normal).type == NK_STYLE_ITEM_IMAGE) {
          r_00.w = fVar12;
          r_00.h = fVar9;
          header.x = (float)uVar2;
          header.y = SUB84(uVar2,4);
          r_00.x = header.x;
          r_00.y = header.y;
          nk_draw_image(&win->buffer,r_00,&(pnVar8->normal).data.image,(nk_color)0xffffffff);
          c.r = '\0';
          c.g = '\0';
          c.b = '\0';
          c.a = '\0';
        }
        else {
          c = (pnVar8->normal).data.color;
          header.x = (float)uVar2;
          header.y = SUB84(uVar2,4);
          rect_00.x = header.x;
          rect_00.y = header.y;
          nk_fill_rect(&win->buffer,rect_00,(ctx->style).combo.rounding,c);
          rect.w = header.w;
          rect.x = header.x;
          rect.y = header.y;
          rect.h = header.h;
          nk_stroke_rect(&win->buffer,rect,(ctx->style).combo.rounding,(ctx->style).combo.border,
                         (ctx->style).combo.border_color);
        }
        lVar7 = 0x1be4;
        if ((ctx->last_widget_state & 0x10) == 0) {
          lVar7 = (ulong)(iVar5 != 0) * 8 + 0x1be0;
        }
        type = *(nk_symbol_type *)((long)&(ctx->input).keyboard.keys[0].down + lVar7);
        fVar12 = (ctx->style).combo.button_padding.y;
        fVar9 = ((header.w + header.x) - header.h) - fVar12;
        local_50.h = header.h - (fVar12 + fVar12);
        nVar1 = (ctx->style).combo.button.padding;
        fVar10 = nVar1.x;
        local_50.x = fVar9 + fVar10;
        fVar11 = nVar1.y;
        local_50.y = header.y + fVar12 + fVar11;
        local_50.w = local_50.h - (fVar10 + fVar10);
        local_50.h = local_50.h - (fVar11 + fVar11);
        nVar1 = (ctx->style).combo.content_padding;
        content.x = header.x + nVar1.x;
        fVar12 = nVar1.y;
        content.y = header.y + fVar12;
        local_40.h = header.h - (fVar12 + fVar12);
        local_40.y = content.y;
        local_40.x = content.x;
        local_40.w = (fVar9 - fVar12) - content.x;
        content.h = local_40.h;
        content.w = local_40.w;
        nk_draw_symbol(&win->buffer,symbol,content,c,foreground,1.0,(ctx->style).font);
        nk_draw_button_symbol
                  (&win->buffer,&local_40,&local_50,ctx->last_widget_state,
                   &(ctx->style).combo.button,type,(ctx->style).font);
        header_00.w = header.w;
        header_00.x = header.x;
        header_00.y = header.y;
        header_00.h = header.h;
        iVar5 = nk_combo_begin(ctx,win,size,(uint)(iVar5 != 0),header_00);
      }
      return iVar5;
    }
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x59cd,
                  "int nk_combo_begin_symbol(struct nk_context *, enum nk_symbol_type, struct nk_vec2)"
                 );
  }
  __assert_fail("ctx->current",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x59cc,
                "int nk_combo_begin_symbol(struct nk_context *, enum nk_symbol_type, struct nk_vec2)"
               );
}

Assistant:

NK_API int
nk_combo_begin_symbol(struct nk_context *ctx, enum nk_symbol_type symbol, struct nk_vec2 size)
{
    struct nk_window *win;
    struct nk_style *style;
    const struct nk_input *in;

    struct nk_rect header;
    int is_clicked = nk_false;
    enum nk_widget_layout_states s;
    const struct nk_style_item *background;
    struct nk_color sym_background;
    struct nk_color symbol_color;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return 0;

    win = ctx->current;
    style = &ctx->style;
    s = nk_widget(&header, ctx);
    if (s == NK_WIDGET_INVALID)
        return 0;

    in = (win->layout->flags & NK_WINDOW_ROM || s == NK_WIDGET_ROM)? 0: &ctx->input;
    if (nk_button_behavior(&ctx->last_widget_state, header, in, NK_BUTTON_DEFAULT))
        is_clicked = nk_true;

    /* draw combo box header background and border */
    if (ctx->last_widget_state & NK_WIDGET_STATE_ACTIVED) {
        background = &style->combo.active;
        symbol_color = style->combo.symbol_active;
    } else if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER) {
        background = &style->combo.hover;
        symbol_color = style->combo.symbol_hover;
    } else {
        background = &style->combo.normal;
        symbol_color = style->combo.symbol_hover;
    }

    if (background->type == NK_STYLE_ITEM_IMAGE) {
        sym_background = nk_rgba(0,0,0,0);
        nk_draw_image(&win->buffer, header, &background->data.image, nk_white);
    } else {
        sym_background = background->data.color;
        nk_fill_rect(&win->buffer, header, style->combo.rounding, background->data.color);
        nk_stroke_rect(&win->buffer, header, style->combo.rounding, style->combo.border, style->combo.border_color);
    }
    {
        struct nk_rect bounds = {0,0,0,0};
        struct nk_rect content;
        struct nk_rect button;

        enum nk_symbol_type sym;
        if (ctx->last_widget_state & NK_WIDGET_STATE_HOVER)
            sym = style->combo.sym_hover;
        else if (is_clicked)
            sym = style->combo.sym_active;
        else sym = style->combo.sym_normal;

        /* calculate button */
        button.w = header.h - 2 * style->combo.button_padding.y;
        button.x = (header.x + header.w - header.h) - style->combo.button_padding.y;
        button.y = header.y + style->combo.button_padding.y;
        button.h = button.w;

        content.x = button.x + style->combo.button.padding.x;
        content.y = button.y + style->combo.button.padding.y;
        content.w = button.w - 2 * style->combo.button.padding.x;
        content.h = button.h - 2 * style->combo.button.padding.y;

        /* draw symbol */
        bounds.h = header.h - 2 * style->combo.content_padding.y;
        bounds.y = header.y + style->combo.content_padding.y;
        bounds.x = header.x + style->combo.content_padding.x;
        bounds.w = (button.x - style->combo.content_padding.y) - bounds.x;
        nk_draw_symbol(&win->buffer, symbol, bounds, sym_background, symbol_color,
            1.0f, style->font);

        /* draw open/close button */
        nk_draw_button_symbol(&win->buffer, &bounds, &content, ctx->last_widget_state,
            &ctx->style.combo.button, sym, style->font);
    }
    return nk_combo_begin(ctx, win, size, is_clicked, header);
}